

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int ARKodeEvolve(void *arkode_mem,sunrealtype tout,N_Vector yout,sunrealtype *tret,int itask)

{
  SUNContext_conflict pSVar1;
  SUNContext_conflict pSVar2;
  double dVar3;
  int iVar4;
  int in_ECX;
  ARKodeMem in_RDX;
  N_Vector in_RSI;
  ARKodeMem in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int attempts;
  ARKodeMem ark_mem;
  int relax_fails;
  int constrfails;
  int nef;
  int ncf;
  int nflag;
  sunrealtype dsm;
  int inactive_roots;
  sunrealtype nrm;
  sunrealtype troundoff;
  int ewtsetOK;
  int ir;
  int istate;
  int kflag;
  int retval;
  long nstloc;
  undefined4 in_stack_ffffffffffffff68;
  int iVar5;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar9;
  int in_stack_ffffffffffffff8c;
  int iVar10;
  sunrealtype in_stack_ffffffffffffff90;
  N_Vector dky;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  sunrealtype in_stack_ffffffffffffffa0;
  double t;
  ARKodeMem in_stack_ffffffffffffffa8;
  int local_48;
  uint local_44;
  uint in_stack_ffffffffffffffc4;
  int *nefPtr;
  undefined4 in_stack_ffffffffffffffd0;
  uint local_4;
  
  pSVar2 = (SUNContext_conflict)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x2a3,"ARKodeEvolve",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = 0xffffffeb;
  }
  else if (in_RDI->MallocDone == 0) {
    arkProcessError(in_RDI,-0x17,0x2ac,"ARKodeEvolve",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"Attempt to call before ARKodeInit.");
    local_4 = 0xffffffe9;
  }
  else {
    in_RDI->ycur = in_RSI;
    if (in_RSI == (N_Vector)0x0) {
      arkProcessError(in_RDI,-0x16,0x2b4,"ARKodeEvolve",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                      ,"yout = NULL illegal.");
      local_4 = 0xffffffea;
    }
    else if (in_RDX == (ARKodeMem)0x0) {
      arkProcessError(in_RDI,-0x16,700,"ARKodeEvolve",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                      ,"tret = NULL illegal.");
      local_4 = 0xffffffea;
    }
    else if ((in_ECX == 1) || (in_ECX == 2)) {
      if (in_RDI->root_mem != (ARKodeRootMem)0x0) {
        if (in_ECX == 1) {
          in_RDI->root_mem->toutc = (sunrealtype)pSVar2;
        }
        in_RDI->root_mem->taskc = in_ECX;
      }
      if (in_RDI->initsetup != 0) {
        pSVar1 = (SUNContext_conflict)in_RDI->tcur;
        in_RDX->sunctx = pSVar1;
        in_RDI->tretlast = (sunrealtype)pSVar1;
        in_stack_ffffffffffffffc4 =
             arkInitialSetup(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        if (in_stack_ffffffffffffffc4 != 0) {
          return in_stack_ffffffffffffffc4;
        }
      }
      if ((in_RDI->initsetup != 0) ||
         (iVar4 = arkStopTests((ARKodeMem)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                               in_stack_ffffffffffffff90,
                               (N_Vector)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                               (sunrealtype *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               in_stack_ffffffffffffff7c,(int *)in_RDI),
         local_4 = in_stack_ffffffffffffffc4, iVar4 == 0)) {
        nefPtr = (int *)0x0;
        do {
          in_RDI->next_h = in_RDI->h;
          if (in_RDI->initsetup == 0) {
            iVar4 = (*in_RDI->efun)(in_RDI->yn,in_RDI->ewt,in_RDI->e_data);
            if (iVar4 != 0) {
              if (in_RDI->itol == 2) {
                arkProcessError(SUB84(in_RDI->tcur,0),(int)in_RDI,-0x16,(char *)0x310,"ARKodeEvolve"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                ,"At t = %.15g, the user-provide EwtSet function failed.");
              }
              else {
                arkProcessError(SUB84(in_RDI->tcur,0),(int)in_RDI,-0x16,(char *)0x315,"ARKodeEvolve"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                ,"At t = %.15g, a component of ewt has become <= 0.");
              }
              local_44 = 0xffffffea;
              pSVar2 = (SUNContext_conflict)in_RDI->tcur;
              in_RDX->sunctx = pSVar2;
              in_RDI->tretlast = (sunrealtype)pSVar2;
              N_VScale(0,in_RDI->yn,in_RSI);
              goto LAB_0019fb76;
            }
            if ((in_RDI->rwt_is_ewt == 0) &&
               (iVar4 = (*in_RDI->rfun)(in_RDI->yn,in_RDI->rwt,in_RDI->r_data), iVar4 != 0)) {
              if (in_RDI->itol == 2) {
                arkProcessError(SUB84(in_RDI->tcur,0),(int)in_RDI,-0x16,(char *)0x326,"ARKodeEvolve"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                ,"At t = %.15g, the user-provide RwtSet function failed.");
              }
              else {
                arkProcessError(SUB84(in_RDI->tcur,0),(int)in_RDI,-0x16,(char *)0x32b,"ARKodeEvolve"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                ,"At t = %.15g, a component of rwt has become <= 0.");
              }
              local_44 = 0xffffffea;
              pSVar2 = (SUNContext_conflict)in_RDI->tcur;
              in_RDX->sunctx = pSVar2;
              in_RDI->tretlast = (sunrealtype)pSVar2;
              N_VScale(0,in_RDI->yn,in_RSI);
              goto LAB_0019fb76;
            }
          }
          if ((0 < in_RDI->mxstep) && (in_RDI->mxstep <= (long)nefPtr)) {
            arkProcessError(SUB84(in_RDI->tcur,0),(int)in_RDI,-1,(char *)0x33a,"ARKodeEvolve",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                            ,"At t = %.15g, mxstep steps taken before reaching tout.");
            local_44 = 0xffffffff;
            pSVar2 = (SUNContext_conflict)in_RDI->tcur;
            in_RDX->sunctx = pSVar2;
            in_RDI->tretlast = (sunrealtype)pSVar2;
            N_VScale(0,in_RDI->yn,in_RSI);
            goto LAB_0019fb76;
          }
          t = (double)N_VWrmsNorm(in_RDI->yn,in_RDI->ewt);
          in_RDI->tolsf = in_RDI->uround * t;
          if ((1.0 < in_RDI->tolsf) && (in_RDI->fixedstep == 0)) {
            arkProcessError(SUB84(in_RDI->tcur,0),(int)in_RDI,-2,(char *)0x347,"ARKodeEvolve",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                            ,"At t = %.15g, too much accuracy requested.");
            local_44 = 0xfffffffe;
            pSVar2 = (SUNContext_conflict)in_RDI->tcur;
            in_RDX->sunctx = pSVar2;
            in_RDI->tretlast = (sunrealtype)pSVar2;
            N_VScale(0,in_RDI->yn,in_RSI);
            in_RDI->tolsf = in_RDI->tolsf * 2.0;
            goto LAB_0019fb76;
          }
          in_RDI->tolsf = 1.0;
          dVar3 = in_RDI->tcur + in_RDI->h;
          if ((dVar3 == in_RDI->tcur) && (!NAN(dVar3) && !NAN(in_RDI->tcur))) {
            in_RDI->nhnil = in_RDI->nhnil + 1;
            if (in_RDI->nhnil <= in_RDI->mxhnil) {
              arkProcessError(SUB84(in_RDI->tcur,0),(int)in_RDI,99,(char *)0x357,"ARKodeEvolve",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                              ,
                              "Internal t = %.15g and h = %.15g are such that t + h = t on the next step. The solver will continue anyway."
                             );
            }
            if (in_RDI->nhnil == in_RDI->mxhnil) {
              arkProcessError(in_RDI,99,0x35c,"ARKodeEvolve",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                              ,
                              "The above warning has been issued mxhnil times and will not be issued again for this problem."
                             );
            }
          }
          if ((in_RDI->hprime != in_RDI->h) || (NAN(in_RDI->hprime) || NAN(in_RDI->h))) {
            in_RDI->h = in_RDI->h * in_RDI->eta;
            in_RDI->next_h = in_RDI->h;
          }
          if (in_RDI->fixedstep != 0) {
            in_RDI->h = in_RDI->hin;
            in_RDI->next_h = in_RDI->h;
            if ((in_RDI->tstopset != 0) &&
               (0.0 < ((in_RDI->tcur + in_RDI->h) - in_RDI->tstop) * in_RDI->h)) {
              in_RDI->h = (in_RDI->tstop - in_RDI->tcur) * (in_RDI->uround * -4.0 + 1.0);
            }
          }
          dky = (N_Vector)0x0;
          iVar4 = 0;
          in_RDI->last_kflag = 0;
          uVar7 = 0;
          uVar8 = 0;
          uVar9 = 0;
          iVar5 = 0;
          uVar6 = 0;
          iVar10 = 6;
          while( true ) {
            if (iVar4 != 0xb) {
              iVar5 = iVar5 + 1;
              in_RDI->nst_attempts = in_RDI->nst_attempts + 1;
            }
            iVar4 = (*in_RDI->step)(in_RDI,(sunrealtype *)&stack0xffffffffffffff90,
                                    (int *)&stack0xffffffffffffff8c);
            if ((((iVar4 < 0) ||
                 (iVar4 = arkCheckConvergence((ARKodeMem)CONCAT44(uVar6,in_stack_ffffffffffffff78),
                                              (int *)in_RDI,
                                              (int *)CONCAT44(iVar5,in_stack_ffffffffffffff68)),
                 iVar4 < 0)) ||
                ((in_RDI->relax_enabled != 0 &&
                 ((iVar4 == 0 &&
                  (iVar4 = arkRelax((ARKodeMem)
                                    CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                    (int *)dky,(sunrealtype *)CONCAT44(iVar10,uVar9)), iVar4 < 0))))
                )) || ((in_RDI->constraintsSet != 0 &&
                       ((iVar4 == 0 &&
                        (iVar4 = arkCheckConstraints((ARKodeMem)
                                                     CONCAT44(in_stack_ffffffffffffff9c,
                                                              in_stack_ffffffffffffff98),(int *)dky,
                                                     (int *)CONCAT44(iVar10,uVar9)), iVar4 < 0))))))
            goto LAB_0019f520;
            if (in_RDI->fixedstep != 0) {
              in_RDI->eta = 1.0;
              goto LAB_0019f520;
            }
            if ((iVar4 == 0) &&
               (iVar4 = arkCheckTemporalError
                                  (in_RDX,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),nefPtr,
                                   (sunrealtype)((ulong)in_stack_ffffffffffffffc4 << 0x20)),
               iVar4 < 0)) goto LAB_0019f520;
            if (in_RDI->force_pass != 0) {
              in_RDI->last_kflag = iVar4;
              iVar4 = 0;
              goto LAB_0019f520;
            }
            if (iVar4 == 0) break;
            if (ABS(in_RDI->h) <= in_RDI->hmin * 1.000001) {
              return -3;
            }
            in_RDI->h = in_RDI->eta * in_RDI->h;
            in_RDI->hprime = in_RDI->h;
            in_RDI->next_h = in_RDI->h;
          }
          iVar4 = 0;
LAB_0019f520:
          if (iVar4 == 0) {
            iVar4 = arkCompleteStep((ARKodeMem)CONCAT44(iVar10,uVar9),
                                    (sunrealtype)CONCAT44(uVar8,uVar7));
          }
          if (iVar4 != 0) {
            local_44 = arkHandleFailure((ARKodeMem)CONCAT44(uVar6,in_stack_ffffffffffffff78),
                                        (int)((ulong)in_RDI >> 0x20));
            pSVar2 = (SUNContext_conflict)in_RDI->tcur;
            in_RDX->sunctx = pSVar2;
            in_RDI->tretlast = (sunrealtype)pSVar2;
            N_VScale(0,in_RDI->yn,in_RSI);
            goto LAB_0019fb76;
          }
          nefPtr = (int *)((long)nefPtr + 1);
          if ((in_RDI->root_mem != (ARKodeRootMem)0x0) && (0 < in_RDI->root_mem->nrtfn)) {
            in_stack_ffffffffffffffc4 = arkRootCheck3((void *)CONCAT44(iVar10,uVar9));
            if (in_stack_ffffffffffffffc4 == 1) {
              in_RDI->root_mem->irfnd = 1;
              local_44 = 2;
              pSVar2 = (SUNContext_conflict)in_RDI->root_mem->tlo;
              in_RDX->sunctx = pSVar2;
              in_RDI->tretlast = (sunrealtype)pSVar2;
              goto LAB_0019fb76;
            }
            if (in_stack_ffffffffffffffc4 == 0xfffffff4) {
              arkProcessError(SUB84(in_RDI->root_mem->tlo,0),(int)in_RDI,-0xc,(char *)0x410,
                              "ARKodeEvolve",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                              ,
                              "At t = %.15g, the rootfinding routine failed in an unrecoverable manner."
                             );
              local_44 = 0xfffffff4;
              goto LAB_0019fb76;
            }
            if (in_RDI->nst == 1) {
              in_stack_ffffffffffffff9c = 0;
              for (local_48 = 0; local_48 < in_RDI->root_mem->nrtfn; local_48 = local_48 + 1) {
                if (in_RDI->root_mem->gactive[local_48] == 0) {
                  in_stack_ffffffffffffff9c = 1;
                  break;
                }
              }
              if ((0 < in_RDI->root_mem->mxgnull) && (in_stack_ffffffffffffff9c != 0)) {
                arkProcessError(in_RDI,99,0x427,"ARKodeEvolve",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                ,
                                "At the end of the first step, there are still some root functions identically 0. This warning will not be issued again."
                               );
              }
            }
          }
          if (in_RDI->tstopset != 0) {
            in_stack_ffffffffffffffa8 =
                 (ARKodeMem)(in_RDI->uround * 100.0 * (ABS(in_RDI->tcur) + ABS(in_RDI->h)));
            if ((double)in_stack_ffffffffffffffa8 < ABS(in_RDI->tcur - in_RDI->tstop)) {
              if (0.0 < ((in_RDI->tcur + in_RDI->hprime) - in_RDI->tstop) * in_RDI->h) {
                in_RDI->hprime = (in_RDI->tstop - in_RDI->tcur) * (in_RDI->uround * -4.0 + 1.0);
                in_RDI->eta = in_RDI->hprime / in_RDI->h;
              }
            }
            else if ((0.0 <= ((double)pSVar2 - in_RDI->tstop) * in_RDI->h) ||
                    (ABS((double)pSVar2 - in_RDI->tstop) <= (double)in_stack_ffffffffffffffa8)) {
              if ((in_RDI->tstopinterp == 0) || (in_RDI->interp == (ARKInterp)0x0)) {
                N_VScale(0,in_RDI->yn,in_RSI);
              }
              else {
                local_44 = ARKodeGetDky(in_stack_ffffffffffffffa8,t,in_stack_ffffffffffffff9c,dky);
                if (local_44 != 0) {
                  arkProcessError(SUB84(in_RDI->tstop,0),(int)in_RDI,(int)(ulong)local_44,
                                  (char *)0x43f,"ARKodeEvolve",
                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                  ,"At t = %.15g, interpolating the solution failed.");
                  goto LAB_0019fb76;
                }
              }
              pSVar2 = (SUNContext_conflict)in_RDI->tstop;
              in_RDX->sunctx = pSVar2;
              in_RDI->tretlast = (sunrealtype)pSVar2;
              in_RDI->tstopset = 0;
              local_44 = 1;
              goto LAB_0019fb76;
            }
          }
          if ((in_ECX == 1) && (0.0 <= (in_RDI->tcur - (double)pSVar2) * in_RDI->h)) {
            if (in_RDI->interp == (ARKInterp)0x0) {
              N_VScale(0,in_RDI->yn,in_RSI);
              pSVar2 = (SUNContext_conflict)in_RDI->tcur;
              in_RDX->sunctx = pSVar2;
              in_RDI->tretlast = (sunrealtype)pSVar2;
            }
            else {
              local_44 = ARKodeGetDky(in_stack_ffffffffffffffa8,t,in_stack_ffffffffffffff9c,dky);
              if (local_44 != 0) {
                arkProcessError(in_XMM0_Da,(int)in_RDI,(int)(ulong)local_44,(char *)0x45e,
                                "ARKodeEvolve",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                                ,"At t = %.15g, interpolating the solution failed.");
                goto LAB_0019fb76;
              }
              in_RDX->sunctx = pSVar2;
              in_RDI->tretlast = (sunrealtype)pSVar2;
            }
            in_RDI->next_h = in_RDI->hprime;
            local_44 = 0;
            goto LAB_0019fb76;
          }
        } while (in_ECX != 2);
        local_44 = 0;
        pSVar2 = (SUNContext_conflict)in_RDI->tcur;
        in_RDX->sunctx = pSVar2;
        in_RDI->tretlast = (sunrealtype)pSVar2;
        N_VScale(0,in_RDI->yn,in_RSI);
        in_RDI->next_h = in_RDI->hprime;
LAB_0019fb76:
        local_4 = local_44;
      }
    }
    else {
      arkProcessError(in_RDI,-0x16,0x2c4,"ARKodeEvolve",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                      ,"Illegal value for itask.");
      local_4 = 0xffffffea;
    }
  }
  return local_4;
}

Assistant:

int ARKodeEvolve(void* arkode_mem, sunrealtype tout, N_Vector yout,
                 sunrealtype* tret, int itask)
{
  long int nstloc;
  int retval, kflag, istate, ir;
  int ewtsetOK;
  sunrealtype troundoff, nrm;
  sunbooleantype inactive_roots;
  sunrealtype dsm;
  int nflag, ncf, nef, constrfails;
  int relax_fails;
  ARKodeMem ark_mem;

  /* used only with debugging logging */
  SUNDIALS_MAYBE_UNUSED int attempts;

  /* Check and process inputs */

  /* Check if ark_mem exists */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }

  /* Check for yout != NULL */
  if ((ark_mem->ycur = yout) == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_YOUT_NULL);
    return (ARK_ILL_INPUT);
  }

  /* Check for tret != NULL */
  if (tret == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_TRET_NULL);
    return (ARK_ILL_INPUT);
  }

  /* Check for valid itask */
  if ((itask != ARK_NORMAL) && (itask != ARK_ONE_STEP))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_ITASK);
    return (ARK_ILL_INPUT);
  }

  /* start profiler */
  SUNDIALS_MARK_FUNCTION_BEGIN(ARK_PROFILER);

  /* store copy of itask if using root-finding */
  if (ark_mem->root_mem != NULL)
  {
    if (itask == ARK_NORMAL) { ark_mem->root_mem->toutc = tout; }
    ark_mem->root_mem->taskc = itask;
  }

  /* perform first-step-specific initializations:
     - initialize tret values to initialization time
     - perform initial integrator setup  */
  if (ark_mem->initsetup)
  {
    ark_mem->tretlast = *tret = ark_mem->tcur;
    retval                    = arkInitialSetup(ark_mem, tout);
    if (retval != ARK_SUCCESS)
    {
      SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
      return (retval);
    }
  }

  /* perform stopping tests */
  if (!ark_mem->initsetup)
  {
    if (arkStopTests(ark_mem, tout, yout, tret, itask, &retval))
    {
      SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
      return (retval);
    }
  }

  /*--------------------------------------------------
    Looping point for successful internal steps

    - update the ewt/rwt vectors for upcoming step
    - check for errors (too many steps, too much
      accuracy requested, step size too small)
    - loop over attempts at a new step:
      * try to take step (via time stepper module),
        handle solver convergence or other failures
      * if the stepper requests ARK_RETRY_STEP, we
        retry the step without accumulating failures.
        A stepper should never request this multiple
        times in a row.
      * perform constraint-handling (if selected)
      * check temporal error
      * if all of the above pass, complete step by
        updating current time, solution, error &
        stepsize history arrays.
    - perform stop tests:
      * check for root in last step taken
      * check if tout was passed
      * check if close to tstop
      * check if in ONE_STEP mode (must return)
    --------------------------------------------------*/
  nstloc = 0;
  for (;;)
  {
    ark_mem->next_h = ark_mem->h;

    /* Reset and check ewt and rwt */
    if (!ark_mem->initsetup)
    {
      ewtsetOK = ark_mem->efun(ark_mem->yn, ark_mem->ewt, ark_mem->e_data);
      if (ewtsetOK != 0)
      {
        if (ark_mem->itol == ARK_WF)
        {
          arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                          MSG_ARK_EWT_NOW_FAIL, ark_mem->tcur);
        }
        else
        {
          arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                          MSG_ARK_EWT_NOW_BAD, ark_mem->tcur);
        }

        istate            = ARK_ILL_INPUT;
        ark_mem->tretlast = *tret = ark_mem->tcur;
        N_VScale(ONE, ark_mem->yn, yout);
        break;
      }

      if (!ark_mem->rwt_is_ewt)
      {
        ewtsetOK = ark_mem->rfun(ark_mem->yn, ark_mem->rwt, ark_mem->r_data);
        if (ewtsetOK != 0)
        {
          if (ark_mem->itol == ARK_WF)
          {
            arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                            __FILE__, MSG_ARK_RWT_NOW_FAIL, ark_mem->tcur);
          }
          else
          {
            arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                            __FILE__, MSG_ARK_RWT_NOW_BAD, ark_mem->tcur);
          }

          istate            = ARK_ILL_INPUT;
          ark_mem->tretlast = *tret = ark_mem->tcur;
          N_VScale(ONE, ark_mem->yn, yout);
          break;
        }
      }
    }

    /* Check for too many steps */
    if ((ark_mem->mxstep > 0) && (nstloc >= ark_mem->mxstep))
    {
      arkProcessError(ark_mem, ARK_TOO_MUCH_WORK, __LINE__, __func__, __FILE__,
                      MSG_ARK_MAX_STEPS, ark_mem->tcur);
      istate            = ARK_TOO_MUCH_WORK;
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      break;
    }

    /* Check for too much accuracy requested */
    nrm            = N_VWrmsNorm(ark_mem->yn, ark_mem->ewt);
    ark_mem->tolsf = ark_mem->uround * nrm;
    if (ark_mem->tolsf > ONE && !ark_mem->fixedstep)
    {
      arkProcessError(ark_mem, ARK_TOO_MUCH_ACC, __LINE__, __func__, __FILE__,
                      MSG_ARK_TOO_MUCH_ACC, ark_mem->tcur);
      istate            = ARK_TOO_MUCH_ACC;
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      ark_mem->tolsf *= TWO;
      break;
    }
    else { ark_mem->tolsf = ONE; }

    /* Check for h below roundoff level in tn */
    if (ark_mem->tcur + ark_mem->h == ark_mem->tcur)
    {
      ark_mem->nhnil++;
      if (ark_mem->nhnil <= ark_mem->mxhnil)
      {
        arkProcessError(ark_mem, ARK_WARNING, __LINE__, __func__, __FILE__,
                        MSG_ARK_HNIL, ark_mem->tcur, ark_mem->h);
      }
      if (ark_mem->nhnil == ark_mem->mxhnil)
      {
        arkProcessError(ark_mem, ARK_WARNING, __LINE__, __func__, __FILE__,
                        MSG_ARK_HNIL_DONE);
      }
    }

    /* Update parameter for upcoming step size */
    if (ark_mem->hprime != ark_mem->h)
    {
      ark_mem->h      = ark_mem->h * ark_mem->eta;
      ark_mem->next_h = ark_mem->h;
    }
    if (ark_mem->fixedstep)
    {
      ark_mem->h      = ark_mem->hin;
      ark_mem->next_h = ark_mem->h;

      /* patch for 'fixedstep' + 'tstop' use case:
         limit fixed step size if step would overtake tstop */
      if (ark_mem->tstopset)
      {
        if ((ark_mem->tcur + ark_mem->h - ark_mem->tstop) * ark_mem->h > ZERO)
        {
          ark_mem->h = (ark_mem->tstop - ark_mem->tcur) *
                       (ONE - FOUR * ark_mem->uround);
        }
      }
    }

    /* Looping point for step attempts */
    dsm      = ZERO;
    kflag    = ARK_SUCCESS;
    attempts = ncf = nef = constrfails = ark_mem->last_kflag = 0;
    relax_fails                                              = 0;
    nflag                                                    = FIRST_CALL;
    for (;;)
    {
      /* increment attempt counters
         Note: kflag can only equal ARK_RETRY_STEP if the stepper rejected
         the current step size before performing calculations. Thus, we do
         not include those when keeping track of step "attempts". */
      if (kflag != ARK_RETRY_STEP)
      {
        attempts++;
        ark_mem->nst_attempts++;
      }

      SUNLogInfo(ARK_LOGGER, "begin-step-attempt",
                 "step = %li, tn = " SUN_FORMAT_G ", h = " SUN_FORMAT_G,
                 ark_mem->nst + 1, ark_mem->tn, ark_mem->h);

      /* Call time stepper module to attempt a step:
            0 => step completed successfully
           >0 => step encountered recoverable failure; reduce step if possible
           <0 => step encountered unrecoverable failure */
      kflag = ark_mem->step((void*)ark_mem, &dsm, &nflag);
      if (kflag < 0)
      {
        /* Log fatal errors here, other returns handled below */
        SUNLogInfo(ARK_LOGGER, "end-step-attempt",
                   "status = failed step, kflag = %i", kflag);
        break;
      }

      /* handle solver convergence failures */
      kflag = arkCheckConvergence(ark_mem, &nflag, &ncf);

      SUNLogInfoIf(kflag != ARK_SUCCESS, ARK_LOGGER, "end-step-attempt",
                   "status = failed step, kflag = %i", kflag);

      if (kflag < 0) { break; }

      /* Perform relaxation:
           - computes relaxation parameter
           - on success, updates ycur, h, and dsm
           - on recoverable failure, updates eta and signals to retry step
           - on fatal error, returns negative error flag */
      if (ark_mem->relax_enabled && (kflag == ARK_SUCCESS))
      {
        kflag = arkRelax(ark_mem, &relax_fails, &dsm);

        SUNLogInfoIf(kflag != ARK_SUCCESS, ARK_LOGGER, "end-step-attempt",
                     "status = failed relaxtion, kflag = %i", kflag);

        if (kflag < 0) { break; }
      }

      /* perform constraint-handling (if selected, and if solver check passed) */
      if (ark_mem->constraintsSet && (kflag == ARK_SUCCESS))
      {
        kflag = arkCheckConstraints(ark_mem, &constrfails, &nflag);

        SUNLogInfoIf(kflag != ARK_SUCCESS, ARK_LOGGER, "end-step-attempt",
                     "status = failed constraints, kflag = %i", kflag);

        if (kflag < 0) { break; }
      }

      /* when fixed time-stepping is enabled, 'success' == successful stage solves
         (checked in previous block), so just enforce no step size change */
      if (ark_mem->fixedstep)
      {
        ark_mem->eta = ONE;
        SUNLogInfo(ARK_LOGGER, "end-step-attempt", "status = success");
        break;
      }

      /* check temporal error (if checks above passed) */
      if (kflag == ARK_SUCCESS)
      {
        kflag = arkCheckTemporalError(ark_mem, &nflag, &nef, dsm);

        SUNLogInfoIf(kflag != ARK_SUCCESS, ARK_LOGGER, "end-step-attempt",
                     "status = failed error test, dsm = " SUN_FORMAT_G
                     ", kflag = %i",
                     dsm, kflag);

        if (kflag < 0) { break; }
      }

      /* if ignoring temporal error test result (XBraid) force step to pass */
      if (ark_mem->force_pass)
      {
        ark_mem->last_kflag = kflag;
        kflag               = ARK_SUCCESS;
        SUNLogInfo(ARK_LOGGER, "end-step-attempt", "status = success");
        break;
      }

      /* break attempt loop on successful step */
      if (kflag == ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-step-attempt",
                   "status = success, dsm = " SUN_FORMAT_G, dsm);
        break;
      }

      /* unsuccessful step, if |h| = hmin, return ARK_ERR_FAILURE */
      if (SUNRabs(ark_mem->h) <= ark_mem->hmin * ONEPSM)
      {
        SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
        return (ARK_ERR_FAILURE);
      }

      /* update h, hprime and next_h for next iteration */
      ark_mem->h *= ark_mem->eta;
      ark_mem->next_h = ark_mem->hprime = ark_mem->h;

    } /* end looping for step attempts */

    /* If step attempt loop succeeded, complete step (update current time, solution,
       error stepsize history arrays; call user-supplied step postprocessing function)
       (added stuff from arkStep_PrepareNextStep -- revisit) */
    if (kflag == ARK_SUCCESS) { kflag = arkCompleteStep(ark_mem, dsm); }

    /* If step attempt loop failed, process flag and return to user */
    if (kflag != ARK_SUCCESS)
    {
      istate            = arkHandleFailure(ark_mem, kflag);
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      break;
    }

    nstloc++;

    /* Check for root in last step taken. */
    if (ark_mem->root_mem != NULL)
    {
      if (ark_mem->root_mem->nrtfn > 0)
      {
        retval = arkRootCheck3((void*)ark_mem);
        if (retval == RTFOUND)
        { /* A new root was found */
          ark_mem->root_mem->irfnd = 1;
          istate                   = ARK_ROOT_RETURN;
          ark_mem->tretlast = *tret = ark_mem->root_mem->tlo;
          break;
        }
        else if (retval == ARK_RTFUNC_FAIL)
        { /* g failed */
          arkProcessError(ark_mem, ARK_RTFUNC_FAIL, __LINE__, __func__, __FILE__,
                          MSG_ARK_RTFUNC_FAILED, ark_mem->root_mem->tlo);
          istate = ARK_RTFUNC_FAIL;
          break;
        }

        /* If we are at the end of the first step and we still have
           some event functions that are inactive, issue a warning
           as this may indicate a user error in the implementation
           of the root function. */
        if (ark_mem->nst == 1)
        {
          inactive_roots = SUNFALSE;
          for (ir = 0; ir < ark_mem->root_mem->nrtfn; ir++)
          {
            if (!ark_mem->root_mem->gactive[ir])
            {
              inactive_roots = SUNTRUE;
              break;
            }
          }
          if ((ark_mem->root_mem->mxgnull > 0) && inactive_roots)
          {
            arkProcessError(ark_mem, ARK_WARNING, __LINE__, __func__, __FILE__,
                            MSG_ARK_INACTIVE_ROOTS);
          }
        }
      }
    }

    /* Check if tn is at tstop or near tstop */
    if (ark_mem->tstopset)
    {
      troundoff = FUZZ_FACTOR * ark_mem->uround *
                  (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));

      if (SUNRabs(ark_mem->tcur - ark_mem->tstop) <= troundoff)
      {
        /* Ensure tout >= tstop, otherwise check for tout return below */
        if ((tout - ark_mem->tstop) * ark_mem->h >= ZERO ||
            SUNRabs(tout - ark_mem->tstop) <= troundoff)
        {
          if (ark_mem->tstopinterp && ark_mem->interp)
          {
            retval = ARKodeGetDky(ark_mem, ark_mem->tstop, 0, yout);
            if (retval != ARK_SUCCESS)
            {
              arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                              MSG_ARK_INTERPOLATION_FAIL, ark_mem->tstop);
              istate = retval;
              break;
            }
          }
          else { N_VScale(ONE, ark_mem->yn, yout); }
          ark_mem->tretlast = *tret = ark_mem->tstop;
          ark_mem->tstopset         = SUNFALSE;
          istate                    = ARK_TSTOP_RETURN;
          break;
        }
      }
      /* limit upcoming step if it will overcome tstop */
      else if ((ark_mem->tcur + ark_mem->hprime - ark_mem->tstop) * ark_mem->h >
               ZERO)
      {
        ark_mem->hprime = (ark_mem->tstop - ark_mem->tcur) *
                          (ONE - FOUR * ark_mem->uround);
        ark_mem->eta = ark_mem->hprime / ark_mem->h;
      }
    }

    /* In NORMAL mode, check if tout reached */
    if ((itask == ARK_NORMAL) && (ark_mem->tcur - tout) * ark_mem->h >= ZERO)
    {
      if (ark_mem->interp)
      {
        retval = ARKodeGetDky(ark_mem, tout, 0, yout);
        if (retval != ARK_SUCCESS)
        {
          arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                          MSG_ARK_INTERPOLATION_FAIL, tout);
          istate = retval;
          break;
        }
        ark_mem->tretlast = *tret = tout;
      }
      else
      {
        N_VScale(ONE, ark_mem->yn, yout);
        ark_mem->tretlast = *tret = ark_mem->tcur;
      }
      ark_mem->next_h = ark_mem->hprime;
      istate          = ARK_SUCCESS;
      break;
    }

    /* In ONE_STEP mode, copy y and exit loop */
    if (itask == ARK_ONE_STEP)
    {
      istate            = ARK_SUCCESS;
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      ark_mem->next_h = ark_mem->hprime;
      break;
    }

  } /* end looping for internal steps */

  /* stop profiler and return */
  SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
  return (istate);
}